

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void __thiscall
Test_Template_FailedInitWithAutoEscape::Test_Template_FailedInitWithAutoEscape
          (Test_Template_FailedInitWithAutoEscape *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  std::vector<void(*)(),std::allocator<void(*)()>>::emplace_back<void(*)()>
            ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,&local_8);
  return;
}

Assistant:

TEST(Template, FailedInitWithAutoEscape) {
  Strip strip = STRIP_WHITESPACE;
  // Taken from HTML Parser test suite.
  string bad_html = "<a href='http://www.google.com' ''>\n";
  ASSERT(NULL == StringToTemplateWithAutoEscaping(bad_html, strip, TC_HTML));

  // Missing quotes around URL, not accepted in URL-taking attributes.
  bad_html = "<a href={{URL}}>bla</a>";
  ASSERT(NULL == StringToTemplateWithAutoEscaping(bad_html, strip, TC_HTML));

  // Missing quotes around STYLE, not accepted in style-taking attributes.
  bad_html = "<div style={{STYLE}}>";
  ASSERT(NULL == StringToTemplateWithAutoEscaping(bad_html, strip, TC_HTML));
}